

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void DoubleProd(jx9_context *pCtx,jx9_hashmap *pMap)

{
  double local_40;
  double dv;
  double dStack_30;
  sxu32 n;
  double dProd;
  jx9_value *pObj;
  jx9_hashmap_node *pEntry;
  jx9_hashmap *pMap_local;
  jx9_context *pCtx_local;
  
  pObj = (jx9_value *)pMap->pFirst;
  dStack_30 = 1.0;
  pEntry = (jx9_hashmap_node *)pMap;
  pMap_local = (jx9_hashmap *)pCtx;
  for (dv._4_4_ = 0; dv._4_4_ < *(uint *)((long)&pEntry->xKey + 0x1c); dv._4_4_ = dv._4_4_ + 1) {
    dProd = (double)HashmapExtractNodeValue((jx9_hashmap_node *)pObj);
    if (((jx9_value *)dProd != (jx9_value *)0x0) && ((((jx9_value *)dProd)->iFlags & 0x160U) == 0))
    {
      if ((((jx9_value *)dProd)->iFlags & 4U) == 0) {
        if ((((jx9_value *)dProd)->iFlags & 10U) == 0) {
          if (((((jx9_value *)dProd)->iFlags & 1U) != 0) &&
             ((((jx9_value *)dProd)->sBlob).nByte != 0)) {
            local_40 = 0.0;
            SyStrToReal((char *)(((jx9_value *)dProd)->sBlob).pBlob,
                        (((jx9_value *)dProd)->sBlob).nByte,&local_40,(char **)0x0);
            dStack_30 = local_40 * dStack_30;
          }
        }
        else {
          dStack_30 = (double)(((jx9_value *)dProd)->x).iVal * dStack_30;
        }
      }
      else {
        dStack_30 = (((jx9_value *)dProd)->x).rVal * dStack_30;
      }
    }
    pObj = *(jx9_value **)&pObj[1].iFlags;
  }
  jx9_result_double((jx9_context *)pMap_local,dStack_30);
  return;
}

Assistant:

static void DoubleProd(jx9_context *pCtx, jx9_hashmap *pMap)
{
	jx9_hashmap_node *pEntry;
	jx9_value *pObj;
	double dProd;
	sxu32 n;
	pEntry = pMap->pFirst;
	dProd = 1;
	for( n = 0 ; n < pMap->nEntry ; n++ ){
		pObj = HashmapExtractNodeValue(pEntry);
		if( pObj && (pObj->iFlags & (MEMOBJ_NULL|MEMOBJ_HASHMAP|MEMOBJ_RES)) == 0){
			if( pObj->iFlags & MEMOBJ_REAL ){
				dProd *= pObj->x.rVal;
			}else if( pObj->iFlags & (MEMOBJ_INT|MEMOBJ_BOOL) ){
				dProd *= (double)pObj->x.iVal;
			}else if( pObj->iFlags & MEMOBJ_STRING ){
				if( SyBlobLength(&pObj->sBlob) > 0 ){
					double dv = 0;
					SyStrToReal((const char *)SyBlobData(&pObj->sBlob), SyBlobLength(&pObj->sBlob), (void *)&dv, 0);
					dProd *= dv;
				}
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	/* Return product */
	jx9_result_double(pCtx, dProd);
}